

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O0

int __thiscall rapidjson::internal::BigInteger::Compare(BigInteger *this,BigInteger *rhs)

{
  size_t sVar1;
  size_t local_28;
  size_t i;
  BigInteger *rhs_local;
  BigInteger *this_local;
  
  if (this->count_ == rhs->count_) {
    sVar1 = this->count_;
    do {
      local_28 = sVar1;
      if (local_28 == 0) {
        return 0;
      }
      sVar1 = local_28 - 1;
    } while (this->digits_[local_28 - 1] == rhs->digits_[local_28 - 1]);
    this_local._4_4_ = 1;
    if (this->digits_[local_28 - 1] < rhs->digits_[local_28 - 1]) {
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = 1;
    if (this->count_ < rhs->count_) {
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Compare(const BigInteger& rhs) const {
        if (count_ != rhs.count_)
            return count_ < rhs.count_ ? -1 : 1;

        for (size_t i = count_; i-- > 0;)
            if (digits_[i] != rhs.digits_[i])
                return digits_[i] < rhs.digits_[i] ? -1 : 1;

        return 0;
    }